

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

int Res_WinComputeRoots(Res_Win_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Res_Win_t *p_local;
  
  Vec_PtrClear(p->vRoots);
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  Res_WinComputeRoots_rec
            (p->pNode,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nWinTfoMax,p->nFanoutLimit,
             p->vRoots);
  iVar1 = Vec_PtrSize(p->vRoots);
  if (iVar1 < 1) {
    __assert_fail("Vec_PtrSize(p->vRoots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0xe4,"int Res_WinComputeRoots(Res_Win_t *)");
  }
  iVar1 = Vec_PtrSize(p->vRoots);
  if ((iVar1 == 1) && (pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,0), pAVar2 == p->pNode)) {
    return 0;
  }
  return 1;
}

Assistant:

int Res_WinComputeRoots( Res_Win_t * p )
{
    Vec_PtrClear( p->vRoots );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Res_WinComputeRoots_rec( p->pNode, p->pNode->Level + p->nWinTfoMax, p->nFanoutLimit, p->vRoots );
    assert( Vec_PtrSize(p->vRoots) > 0 );
    if ( Vec_PtrSize(p->vRoots) == 1 && Vec_PtrEntry(p->vRoots, 0) == p->pNode )
        return 0;
    return 1;
}